

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O2

void __thiscall
Callback::Emitter::emit<MyEmitter,String>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0)

{
  String *in_RCX;
  code *pcVar1;
  long *plVar2;
  SignalActivation activation;
  SignalActivation SStack_88;
  MemberFuncPtr local_60;
  String local_50;
  
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)(String)>(&local_60,signal);
  SignalActivation::SignalActivation(&SStack_88,this,&local_60);
  for (; SStack_88.begin.item != SStack_88.end.item;
      SStack_88.begin.item = (SStack_88.begin.item)->next) {
    if (((SStack_88.begin.item)->value).state == connected) {
      pcVar1 = (code *)((SStack_88.begin.item)->value).slot.ptr;
      plVar2 = (long *)((long)((SStack_88.begin.item)->value).object +
                       *(long *)&((SStack_88.begin.item)->value).slot.field_0x8);
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
      }
      String::String(&local_50,in_RCX);
      (*pcVar1)(plVar2,&local_50);
      String::~String(&local_50);
    }
    if (SStack_88.invalidated != false) break;
  }
  SignalActivation::~SignalActivation(&SStack_88);
  return;
}

Assistant:

void emit(void (X::*signal)(A), A arg0) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr1<X, A>*)&i->slot)->ptr)(arg0); if(activation.invalidated) return;}}